

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CRNTOCommand::doWhat(CRNTOCommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  int iVar2;
  allocator local_41;
  string ret;
  
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 4) {
    EVar1 = CClient::GetClientState(pClient);
    if ((int)EVar1 < 3) {
      std::__cxx11::string::string
                ((string *)&ret,"530 Please login with USER and PASS.\r\n",&local_41);
      CClient::sendMsg(pClient,&ret);
    }
    else {
      std::__cxx11::string::string((string *)&ret,"503 RNFR required first.\r\n",&local_41);
      CClient::sendMsg(pClient,&ret);
    }
  }
  else {
    CClient::GetUserDir_abi_cxx11_(&ret,pClient);
    chdir(ret._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&ret);
    CClient::GetClientLastFileName_abi_cxx11_(&ret,pClient);
    iVar2 = rename(ret._M_dataplus._M_p,(this->super_CCommand).m_Args._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&ret);
    if (iVar2 == 0) {
      std::__cxx11::string::string((string *)&ret,"250 Rename successful.\r\n",&local_41);
      CClient::sendMsg(pClient,&ret);
      CClient::SetClientState(pClient,PASS);
      std::__cxx11::string::~string((string *)&ret);
      return 1;
    }
    std::__cxx11::string::string((string *)&ret,"550 Rename failed.\r\n",&local_41);
    CClient::sendMsg(pClient,&ret);
    CClient::SetClientState(pClient,PASS);
  }
  std::__cxx11::string::~string((string *)&ret);
  return -1;
}

Assistant:

int CRNTOCommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= RNFR) {
        chdir(pClient->GetUserDir().c_str());
        if(0 == rename(pClient->GetClientLastFileName().c_str(),m_Args.c_str())){
            string ret = "250 Rename successful.\r\n";
            pClient->sendMsg(ret);
            pClient->SetClientState(PASS);
            return 1;
        }
        else{
            string ret = "550 Rename failed.\r\n";
            pClient->sendMsg(ret);
            pClient->SetClientState(PASS);
            return -1;
        }
    }
    else if(pClient->GetClientState() >= PASS){
        string ret = "503 RNFR required first.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}